

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *f;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  ulong *puVar7;
  char **ppcVar8;
  string file;
  string outdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RCO rco;
  char *local_270;
  long local_268;
  char local_260 [16];
  ulong *local_250;
  undefined8 local_248;
  ulong local_240;
  undefined8 uStack_238;
  char *local_230;
  long local_228;
  char local_220 [16];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  string local_1d0;
  RCO local_1b0;
  
  local_270 = local_260;
  local_268 = 0;
  local_260[0] = '\0';
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,".","");
  if (0 < argc) {
    uVar6 = 0;
    do {
      pcVar1 = argv[uVar6];
      if (((pcVar1 != (char *)0x0) && (sVar3 = strlen(pcVar1), 2 < (int)sVar3)) && (*pcVar1 == '-'))
      {
        if (pcVar1[1] == 'f') {
          ppcVar8 = &local_270;
        }
        else {
          if (pcVar1[2] != 'd') goto LAB_0010376b;
          ppcVar8 = &local_230;
        }
        pcVar2 = ppcVar8[1];
        strlen(pcVar1 + 2);
        std::__cxx11::string::_M_replace((ulong)ppcVar8,0,pcVar2,(ulong)(pcVar1 + 2));
      }
LAB_0010376b:
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  if (local_268 == 0) {
    if (1 < argc) {
      pcVar1 = argv[1];
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_270,0,(char *)0x0,(ulong)pcVar1);
    }
    if (local_268 != 0) goto LAB_001037b1;
  }
  else {
LAB_001037b1:
    f = fopen(local_270,"rb");
    if (f != (FILE *)0x0) {
      RCO::RCO(&local_1b0,(FILE *)f);
      if (local_270[1] == ':') {
        std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
        std::__cxx11::string::operator=((string *)&local_230,(string *)&local_250);
        puVar7 = local_250;
        if (local_250 != &local_240) {
LAB_00103822:
          operator_delete(puVar7);
        }
      }
      else {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_230,local_230 + local_228);
        std::__cxx11::string::append((char *)&local_210);
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&local_270);
        uVar6 = 0xf;
        if (local_210 != local_200) {
          uVar6 = local_200[0];
        }
        if (uVar6 < (ulong)(local_1e8 + local_208)) {
          uVar6 = 0xf;
          if (local_1f0 != local_1e0) {
            uVar6 = local_1e0[0];
          }
          if (uVar6 < (ulong)(local_1e8 + local_208)) goto LAB_001039bc;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_001039bc:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
        }
        local_250 = &local_240;
        puVar7 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar7) {
          local_240 = *puVar7;
          uStack_238 = puVar4[3];
        }
        else {
          local_240 = *puVar7;
          local_250 = (ulong *)*puVar4;
        }
        local_248 = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)puVar7 = 0;
        std::__cxx11::string::operator=((string *)&local_230,(string *)&local_250);
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        puVar7 = local_210;
        if (local_210 != local_200) goto LAB_00103822;
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_230,local_230 + local_228);
      RCO::dump(&local_1b0,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1b0.mStringTable._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1b0.mFiles._M_h);
      std::
      _Hashtable<int,_std::pair<const_int,_RCOElement>,_std::allocator<std::pair<const_int,_RCOElement>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b0.mElements._M_h);
      std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector
                (&local_1b0.mRootElement.children);
      std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector
                (&local_1b0.mRootElement.siblings);
      std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::~vector
                (&local_1b0.mRootElement.attributes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.mRootElement.name._M_dataplus._M_p != &local_1b0.mRootElement.name.field_2) {
        operator_delete(local_1b0.mRootElement.name._M_dataplus._M_p);
      }
      iVar5 = 0;
      goto LAB_001038ee;
    }
  }
  iVar5 = 1;
LAB_001038ee:
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *f;
	std::string file;
	std::string outdir = ".";

	// Loop over arguments and handle accordingly.
	// -fINPUT_FILE
	// -dOUTPUT_DIR
	for (int i = 0; i < argc; i++)
	{
		if (argv[i] != nullptr)
		{
			int arglen = strlen(argv[i]);
			if (arglen > 2)
			{
				if (argv[i][0] == '-' && argv[i][1] == 'f')
				{
					file = &argv[i][2];
				}
				else if (argv[i][0] == '-' && argv[i][2] == 'd')
				{
					outdir = &argv[i][2];
				}
			}
		}
	}

	// If no -f or -d, attempt to parse any >1 args as input files, 
	// allows to keep supporting drag&drop on windows
	if (file.empty())
	{
		if (argc > 1)
			file = argv[1];
		
		if (file.empty())
			return 1;	
	}

	f = fopen(file.c_str(), "rb");
	if (!f)
		return 1;

	// Got an absolute file
	RCO rco(f);
	
	if (file[1] == ':')
		outdir = file.substr(0, file.length() - 4);
	else
		outdir = outdir + "/" + file.substr(0, file.length() - 4);
	rco.dump(outdir);

    return 0;
}